

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

void __thiscall
duckdb::MultiFileOptions::AutoDetectHivePartitioning
          (MultiFileOptions *this,MultiFileList *files,ClientContext *context)

{
  bool bVar1;
  size_type sVar2;
  byte bVar3;
  int iVar4;
  InvalidInputException *this_00;
  undefined4 in_ECX;
  string local_40;
  
  iVar4 = (*files->_vptr_MultiFileList[5])(files);
  if ((char)iVar4 != '\0') {
    bVar3 = this->hive_partitioning;
    bVar1 = this->auto_detect_hive_partitioning;
    sVar2 = (this->hive_types_schema)._M_h._M_element_count;
    if (sVar2 != 0 && ((bVar1 | bVar3) & 1) == 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"cannot disable hive_partitioning when hive_types is enabled",
                 "");
      InvalidInputException::InvalidInputException(this_00,&local_40);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((~bVar1 | bVar3) & 1) == 0 && sVar2 != 0) {
      this->hive_partitioning = true;
      this->auto_detect_hive_partitioning = false;
    }
    else {
      if (bVar1 != false) {
        bVar3 = AutoDetectHivePartitioningInternal
                          (files,(ClientContext *)
                                 (ulong)CONCAT31((int3)((uint)in_ECX >> 8),
                                                 ~bVar1 | bVar3 | sVar2 == 0));
        this->hive_partitioning = (bool)bVar3;
      }
      if ((bVar3 & 1) == 0) {
        return;
      }
    }
    if (this->hive_types_autocast == true) {
      AutoDetectHiveTypesInternal(this,files,context);
      return;
    }
  }
  return;
}

Assistant:

void MultiFileOptions::AutoDetectHivePartitioning(MultiFileList &files, ClientContext &context) {
	if (files.GetExpandResult() == FileExpandResult::NO_FILES) {
		return;
	}
	const bool hp_explicitly_disabled = !auto_detect_hive_partitioning && !hive_partitioning;
	const bool ht_enabled = !hive_types_schema.empty();
	if (hp_explicitly_disabled && ht_enabled) {
		throw InvalidInputException("cannot disable hive_partitioning when hive_types is enabled");
	}
	if (ht_enabled && auto_detect_hive_partitioning && !hive_partitioning) {
		// hive_types flag implies hive_partitioning
		hive_partitioning = true;
		auto_detect_hive_partitioning = false;
	}
	if (auto_detect_hive_partitioning) {
		hive_partitioning = AutoDetectHivePartitioningInternal(files, context);
	}
	if (hive_partitioning && hive_types_autocast) {
		AutoDetectHiveTypesInternal(files, context);
	}
}